

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

void bf_store(CPUM68KState_conflict *env,uint32_t addr,int blen,uint64_t data,uintptr_t ra)

{
  uint32_t val;
  
  val = (uint32_t)data;
  switch(blen) {
  case 0:
    cpu_stb_data_ra_m68k(env,addr,val,ra);
    return;
  case 1:
    cpu_stw_data_ra_m68k(env,addr,val,ra);
    return;
  case 2:
  case 3:
    cpu_stl_data_ra_m68k(env,addr,val,ra);
    return;
  case 4:
    cpu_stq_data_ra_m68k(env,addr,data,ra);
    return;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/op_helper.c"
               ,0x329,(char *)0x0);
  }
}

Assistant:

static void bf_store(CPUM68KState *env, uint32_t addr, int blen,
                     uint64_t data, uintptr_t ra)
{
    switch (blen) {
    case 0:
        cpu_stb_data_ra(env, addr, data, ra);
        break;
    case 1:
        cpu_stw_data_ra(env, addr, data, ra);
        break;
    case 2:
    case 3:
        cpu_stl_data_ra(env, addr, data, ra);
        break;
    case 4:
        cpu_stq_data_ra(env, addr, data, ra);
        break;
    default:
        g_assert_not_reached();
    }
}